

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defaults.c
# Opt level: O0

void default_finalize_send_packet
               (quicly_crypto_engine_t *engine,quicly_conn_t *conn,
               ptls_cipher_context_t *header_protect_ctx,ptls_aead_context_t *packet_protect_ctx,
               ptls_iovec_t datagram,size_t first_byte_at,size_t payload_from,uint64_t packet_number
               ,int coalesced)

{
  byte bVar1;
  size_t inlen;
  ptls_aead_context_t *in_RCX;
  long lVar2;
  uint64_t in_RDX;
  size_t in_RSI;
  ptls_aead_supplementary_encryption_t *in_RDI;
  long in_R8;
  long in_stack_00000008;
  size_t i;
  ptls_aead_supplementary_encryption_t supp;
  void *in_stack_ffffffffffffffa8;
  long lVar3;
  byte in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc1;
  void *in_stack_ffffffffffffffc8;
  
  inlen = in_R8 + i + 2;
  memset(&stack0xffffffffffffffc0,0,0x10);
  ptls_aead_encrypt_s(in_RCX,in_stack_ffffffffffffffc8,
                      (void *)CONCAT71(in_stack_ffffffffffffffc1,in_stack_ffffffffffffffc0),inlen,
                      in_RDX,in_stack_ffffffffffffffa8,in_RSI,in_RDI);
  bVar1 = 0x1f;
  if ((*(byte *)(in_R8 + in_stack_00000008) & 0x80) != 0) {
    bVar1 = 0xf;
  }
  *(byte *)(in_R8 + in_stack_00000008) =
       *(byte *)(in_R8 + in_stack_00000008) ^ in_stack_ffffffffffffffc0 & bVar1;
  for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
    lVar2 = i + lVar3 + -2;
    *(byte *)(in_R8 + lVar2) = *(byte *)(in_R8 + lVar2) ^ (&stack0xffffffffffffffc1)[lVar3];
  }
  return;
}

Assistant:

static void default_finalize_send_packet(quicly_crypto_engine_t *engine, quicly_conn_t *conn,
                                         ptls_cipher_context_t *header_protect_ctx, ptls_aead_context_t *packet_protect_ctx,
                                         ptls_iovec_t datagram, size_t first_byte_at, size_t payload_from, uint64_t packet_number,
                                         int coalesced)
{
    ptls_aead_supplementary_encryption_t supp = {.ctx = header_protect_ctx,
                                                 .input = datagram.base + payload_from - QUICLY_SEND_PN_SIZE + QUICLY_MAX_PN_SIZE};

    ptls_aead_encrypt_s(packet_protect_ctx, datagram.base + payload_from, datagram.base + payload_from,
                        datagram.len - payload_from - packet_protect_ctx->algo->tag_size, packet_number,
                        datagram.base + first_byte_at, payload_from - first_byte_at, &supp);

    datagram.base[first_byte_at] ^= supp.output[0] & (QUICLY_PACKET_IS_LONG_HEADER(datagram.base[first_byte_at]) ? 0xf : 0x1f);
    for (size_t i = 0; i != QUICLY_SEND_PN_SIZE; ++i)
        datagram.base[payload_from + i - QUICLY_SEND_PN_SIZE] ^= supp.output[i + 1];
}